

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_srand(uint seed)

{
  uint seed_00;
  uint uVar1;
  uint in_EDI;
  uint old;
  int i;
  int local_8;
  
  seed_00 = stb_srandLCG(in_EDI);
  for (local_8 = 0; local_8 < 0x270; local_8 = local_8 + 1) {
    uVar1 = stb_randLCG();
    stb__mt_buffer[local_8] = uVar1;
  }
  stb_srandLCG(seed_00);
  stb__mt_index = 0x9c0;
  return;
}

Assistant:

void stb_srand(unsigned int seed)
{
   int i;
   unsigned int old = stb_srandLCG(seed);
   for (i = 0; i < STB__MT_LEN; i++)
      stb__mt_buffer[i] = stb_randLCG();
   stb_srandLCG(old);
   stb__mt_index = STB__MT_LEN*sizeof(unsigned int);
}